

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_types.h
# Opt level: O1

void __thiscall
Clasp::SingleOwnerPtr<Clasp::Asp::LpStats,_Clasp::DeleteObject>::reset
          (SingleOwnerPtr<Clasp::Asp::LpStats,_Clasp::DeleteObject> *this,LpStats *x)

{
  LpStats *pLVar1;
  
  pLVar1 = (LpStats *)(this->ptr_ & 0xfffffffffffffffe);
  if (((this->ptr_ & 1) != 0 && pLVar1 != x) &&
     (this->ptr_ = (uintp)pLVar1, pLVar1 != (LpStats *)0x0)) {
    operator_delete(pLVar1);
  }
  this->ptr_ = (ulong)x | 1;
  return;
}

Assistant:

void reset(T* x)             {
		if (x != get() && is_owner()) { D deleter; deleter(release()); }
		ptr_ = set_bit(uintp(x),0);
	}